

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

ym2612_ * YM2612_Init(UINT32 Clock,UINT32 Rate,UINT8 Interpolation)

{
  double dVar1;
  int iVar2;
  ym2612_ *pyVar3;
  uint *puVar4;
  int (*paiVar5) [32];
  ulong uVar6;
  UINT8 (*paUVar7) [32];
  int *piVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  
  if ((Clock == 0 || Rate == 0) || (pyVar3 = (ym2612_ *)calloc(1,0x4958), pyVar3 == (ym2612_ *)0x0))
  {
    return (ym2612_ *)0x0;
  }
  pyVar3->Clock = Clock;
  pyVar3->Rate = Rate;
  dVar1 = ((double)(int)Clock / (double)(int)Rate) / 144.0;
  pyVar3->Enable_SSGEG = '\0';
  pyVar3->DAC_Highpass_Enable = '\0';
  pyVar3->Frequence = dVar1;
  pyVar3->TimerBase = (int)(dVar1 * 4096.0);
  if ((Interpolation == '\0') || (dVar1 <= 1.0)) {
    pyVar3->Inter_Cnt = 0;
    pyVar3->Inter_Step = 0x4000;
  }
  else {
    pyVar3->Inter_Step = (uint)(long)((1.0 / dVar1) * 16384.0);
    pyVar3->Inter_Cnt = 0;
    pyVar3->Rate = (int)Clock / 0x90;
    pyVar3->Frequence = 1.0;
  }
  uVar10 = 0;
  piVar8 = TL_TAB;
  do {
    if (uVar10 < 0xd00) {
      dVar1 = pow(10.0,((double)(int)uVar10 * 0.0234375) / 20.0);
      *piVar8 = (int)(268435455.0 / dVar1);
      iVar2 = -(int)(268435455.0 / dVar1);
      uVar6 = uVar10 | 0x3000;
    }
    else {
      *piVar8 = 0;
      uVar6 = uVar10 + 0x3000;
      iVar2 = 0;
    }
    TL_TAB[uVar6] = iVar2;
    uVar10 = uVar10 + 1;
    piVar8 = piVar8 + 1;
  } while (uVar10 != 0x3000);
  SIN_TAB[0x800] = TL_TAB + 0xd00;
  SIN_TAB[0] = TL_TAB + 0xd00;
  lVar9 = 1;
  lVar11 = 0x7ff;
  do {
    dVar1 = sin((double)(int)lVar9 * 6.283185307179586 * 0.000244140625);
    dVar1 = log10(1.0 / dVar1);
    iVar2 = (int)((dVar1 * 20.0) / 0.0234375);
    if (0xcff < iVar2) {
      iVar2 = 0xd00;
    }
    SIN_TAB[lVar11] = TL_TAB + iVar2;
    SIN_TAB[lVar9] = TL_TAB + iVar2;
    piVar8 = (int *)((long)iVar2 * 4 + 0x1ed6b0);
    SIN_TAB[lVar11 + 0x800] = piVar8;
    SIN_TAB[lVar9 + 0x800] = piVar8;
    lVar9 = lVar9 + 1;
    lVar11 = lVar11 + -1;
  } while (lVar11 != 0x3ff);
  lVar11 = 0;
  lVar9 = 0;
  do {
    dVar1 = (double)(int)lVar9 * 6.283185307179586 * 0.0009765625;
    dVar12 = sin(dVar1);
    *(int *)((long)LFO_ENV_TAB + lVar11) = (int)((dVar12 + 1.0) * 0.5 * 503.4666666666667);
    dVar1 = sin(dVar1);
    *(int *)((long)LFO_FREQ_TAB + lVar11) = (int)(dVar1 * 511.0);
    lVar9 = lVar9 + 1;
    lVar11 = lVar11 + 4;
  } while (lVar9 != 0x400);
  iVar2 = 0xfff;
  lVar9 = 0;
  do {
    dVar1 = pow((double)iVar2 * 0.000244140625,8.0);
    ENV_TAB[lVar9] = (int)(dVar1 * 4096.0);
    ENV_TAB[lVar9 + 0x1000] = (int)((double)(int)lVar9 * 0.000244140625 * 4096.0);
    lVar9 = lVar9 + 1;
    iVar2 = iVar2 + -1;
  } while (lVar9 != 0x1000);
  ENV_TAB[0x2000] = 0xfff;
  iVar2 = 0xfff;
  uVar10 = 0;
  do {
    if (iVar2 != 0) {
      lVar9 = 0;
      do {
        if (uVar10 <= ENV_TAB[lVar9 + iVar2]) {
          iVar2 = iVar2 + (int)lVar9;
          goto LAB_0013232f;
        }
        lVar9 = lVar9 + -1;
      } while (-lVar9 != (long)iVar2);
      iVar2 = 0;
    }
LAB_0013232f:
    DECAY_TO_ATTACK[uVar10] = iVar2 << 0x10;
    uVar10 = uVar10 + 1;
    if (uVar10 == 0x1000) {
      puVar4 = SL_TAB;
      lVar9 = 0;
      do {
        *puVar4 = (int)((double)(int)lVar9 / 0.0234375) * 0x10000 + 0x10000000;
        lVar9 = lVar9 + 3;
        puVar4 = puVar4 + 1;
      } while (lVar9 != 0x2d);
      SL_TAB[0xf] = 0x1fff0000;
      dVar1 = pyVar3->Frequence;
      lVar9 = 0;
      do {
        pyVar3->FINC_TAB[lVar9] = (uint)(long)((double)(int)lVar9 * dVar1 * 4096.0 * 0.5);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x800);
      pyVar3->AR_TAB[0] = 0;
      pyVar3->AR_TAB[1] = 0;
      pyVar3->AR_TAB[2] = 0;
      pyVar3->AR_TAB[3] = 0;
      pyVar3->DR_TAB[0] = 0;
      pyVar3->DR_TAB[1] = 0;
      pyVar3->DR_TAB[2] = 0;
      pyVar3->DR_TAB[3] = 0;
      dVar1 = pyVar3->Frequence;
      uVar10 = 0;
      do {
        dVar12 = (double)(1 << ((byte)(uVar10 >> 2) & 0x1f)) *
                 ((double)((uint)uVar10 & 3) * 0.25 + 1.0) * dVar1 * 268435456.0;
        pyVar3->AR_TAB[uVar10 + 4] = (uint)(long)(dVar12 / 399128.0);
        pyVar3->DR_TAB[uVar10 + 4] = (uint)(long)(dVar12 / 5514396.0);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 0x3c);
      NULL_RATE[0x1c] = 0;
      NULL_RATE[0x1d] = 0;
      NULL_RATE[0x1e] = 0;
      NULL_RATE[0x1f] = 0;
      NULL_RATE[0x18] = 0;
      NULL_RATE[0x19] = 0;
      NULL_RATE[0x1a] = 0;
      NULL_RATE[0x1b] = 0;
      NULL_RATE[0x14] = 0;
      NULL_RATE[0x15] = 0;
      NULL_RATE[0x16] = 0;
      NULL_RATE[0x17] = 0;
      NULL_RATE[0x10] = 0;
      NULL_RATE[0x11] = 0;
      NULL_RATE[0x12] = 0;
      NULL_RATE[0x13] = 0;
      NULL_RATE[0xc] = 0;
      NULL_RATE[0xd] = 0;
      NULL_RATE[0xe] = 0;
      NULL_RATE[0xf] = 0;
      NULL_RATE[8] = 0;
      NULL_RATE[9] = 0;
      NULL_RATE[10] = 0;
      NULL_RATE[0xb] = 0;
      NULL_RATE[4] = 0;
      NULL_RATE[5] = 0;
      NULL_RATE[6] = 0;
      NULL_RATE[7] = 0;
      NULL_RATE[0] = 0;
      NULL_RATE[1] = 0;
      NULL_RATE[2] = 0;
      NULL_RATE[3] = 0;
      lVar9 = 0xd24;
      do {
        *(uint *)((long)pyVar3 + lVar9 * 4 + -0x200) = pyVar3->AR_TAB[0x3f];
        pyVar3->CHANNEL[0].S0_OUT[lVar9 + -0x18] = pyVar3->DR_TAB[0x3f];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0xd44);
      dVar1 = pyVar3->Frequence;
      paiVar5 = pyVar3->DT_TAB + 4;
      paUVar7 = DT_DEF_TAB;
      lVar9 = 0;
      do {
        lVar11 = 0;
        do {
          dVar12 = (double)(*paUVar7)[lVar11] * dVar1 * 32.0;
          paiVar5[-4][lVar11] = (int)dVar12;
          (*paiVar5)[lVar11] = (int)-dVar12;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x20);
        lVar9 = lVar9 + 1;
        paUVar7 = paUVar7 + 1;
        paiVar5 = paiVar5 + 1;
      } while (lVar9 != 4);
      dVar1 = (double)(pyVar3->Inter_Step * pyVar3->Rate >> 0xe);
      pyVar3->LFO_INC_TAB[0] = (int)(long)(1068373114.88 / dVar1);
      pyVar3->LFO_INC_TAB[1] = (int)(long)(1492501135.36 / dVar1);
      pyVar3->LFO_INC_TAB[2] = (int)(long)(1615981445.12 / dVar1);
      pyVar3->LFO_INC_TAB[3] = (int)(long)(1709933854.72 / dVar1);
      pyVar3->LFO_INC_TAB[4] = (int)(long)(1846835937.28 / dVar1);
      pyVar3->LFO_INC_TAB[5] = (int)(long)(2585033441.28 / dVar1);
      pyVar3->LFO_INC_TAB[6] = (int)(long)(12911745433.6 / dVar1);
      pyVar3->LFO_INC_TAB[7] = (int)(long)(19381039923.2 / dVar1);
      lVar9 = 0x2e0;
      do {
        *(undefined1 *)((long)pyVar3->CHANNEL[0].S0_OUT + lVar9 + -0x60) = 0;
        lVar9 = lVar9 + 0x288;
      } while (lVar9 != 0x1210);
      pyVar3->DAC_Mute = '\0';
      return pyVar3;
    }
  } while( true );
}

Assistant:

ym2612_ *YM2612_Init(UINT32 Clock, UINT32 Rate, UINT8 Interpolation)
{
  ym2612_ *YM2612;
  int i, j;
  double x;

  if ((Rate == 0) || (Clock == 0))
    return NULL;

  YM2612 = (ym2612_ *)calloc(1, sizeof(ym2612_));
  if (YM2612 == NULL)
    return YM2612;

#if YM_DEBUG_LEVEL > 0
  if (debug_file == NULL)
  {
    debug_file = fopen("ym2612.log", "w");
    fprintf(debug_file, "YM2612 logging :\n\n");
  }
#endif

  YM2612->Clock = Clock;
  YM2612->Rate = Rate;

  YM2612->DAC_Highpass_Enable = 0;
  YM2612->Enable_SSGEG = 0;

  // 144 = 12 * (prescale * 2) = 12 * 6 * 2
  // prescale set to 6 by default

  YM2612->Frequence = ((double)(YM2612->Clock) / (double)(YM2612->Rate)) / 144.0;
  YM2612->TimerBase = (int) (YM2612->Frequence * 4096.0);

  if ((Interpolation) && (YM2612->Frequence > 1.0))
  {
    YM2612->Inter_Step = (unsigned int) ((1.0 / YM2612->Frequence) * (double) (0x4000));
    YM2612->Inter_Cnt = 0;

    // We recalculate rate and frequence after interpolation

    YM2612->Rate = YM2612->Clock / 144;
    YM2612->Frequence = 1.0;
  }
  else
  {
    YM2612->Inter_Step = 0x4000;
    YM2612->Inter_Cnt = 0;
  }

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "YM2612 frequence = %g rate = %d  interp step = %.8X\n\n", YM2612->Frequence, YM2612->Rate, YM2612->Inter_Step);
#endif

  // Tableau TL :
  // [0     -  4095] = +output  [4095  - ...] = +output overflow (fill with 0)
  // [12288 - 16383] = -output  [16384 - ...] = -output overflow (fill with 0)

  for (i = 0; i < TL_LENGTH; i++)
  {
    if (i >= PG_CUT_OFF)  // YM2612 cut off sound after 78 dB (14 bits output ?)
    {
      TL_TAB[TL_LENGTH + i] = TL_TAB[i] = 0;
    }
    else
    {
      x = MAX_OUT;                // Max output
      x /= pow(10, (ENV_STEP * i) / 20);      // Decibel -> Voltage

      TL_TAB[i] = (int) x;
      TL_TAB[TL_LENGTH + i] = -TL_TAB[i];
    }

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "TL_TAB[%d] = %.8X    TL_TAB[%d] = %.8X\n", i, TL_TAB[i], TL_LENGTH + i, TL_TAB[TL_LENGTH + i]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau SIN :
  // SIN_TAB[x][y] = sin(x) * y;
  // x = phase and y = volume

  SIN_TAB[0] = SIN_TAB[SIN_LENGTH / 2] = &TL_TAB[(int) PG_CUT_OFF];

  for (i = 1; i <= SIN_LENGTH / 4; i++)
  {
    x = sin(2.0 * M_PI * (double) (i) / (double) (SIN_LENGTH));  // Sinus
    x = 20 * log10(1 / x);                    // convert to dB

    j = (int) (x / ENV_STEP);            // Get TL range

    if (j > PG_CUT_OFF)
      j = (int) PG_CUT_OFF;

    SIN_TAB[i] = SIN_TAB[(SIN_LENGTH / 2) - i] = &TL_TAB[j];
    SIN_TAB[(SIN_LENGTH / 2) + i] = SIN_TAB[SIN_LENGTH - i] = &TL_TAB[TL_LENGTH + j];

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X\n", i, SIN_TAB[i][0], (SIN_LENGTH / 2) - i, SIN_TAB[(SIN_LENGTH / 2) - i][0], (SIN_LENGTH / 2) + i, SIN_TAB[(SIN_LENGTH / 2) + i][0], SIN_LENGTH - i, SIN_TAB[SIN_LENGTH - i][0]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau LFO (LFO wav) :

  for (i = 0; i < LFO_LENGTH; i++)
  {
    x = sin(2.0 * M_PI * (double) (i) / (double) (LFO_LENGTH));  // Sinus
    x += 1.0;
    x /= 2.0;          // positive only
    x *= 11.8 / ENV_STEP;    // ajusted to MAX enveloppe modulation

    LFO_ENV_TAB[i] = (int) x;

    x = sin(2.0 * M_PI * (double) (i) / (double) (LFO_LENGTH));  // Sinus
    x *= (double) ((1 << (LFO_HBITS - 1)) - 1);

    LFO_FREQ_TAB[i] = (int) x;

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "LFO[%d] = %.8X\n", i, LFO_ENV_TAB[i]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau Enveloppe :
  // ENV_TAB[0] -> ENV_TAB[ENV_LENGTH - 1]        = attack curve
  // ENV_TAB[ENV_LENGTH] -> ENV_TAB[2 * ENV_LENGTH - 1]  = decay curve

  for (i = 0; i < ENV_LENGTH; i++)
  {
    // Attack curve (x^8 - music level 2 Vectorman 2)
    x = pow(((double) ((ENV_LENGTH - 1) - i) / (double) (ENV_LENGTH)), 8);
    x *= ENV_LENGTH;

    ENV_TAB[i] = (int) x;

    // Decay curve (just linear)
    x = pow(((double) (i) / (double) (ENV_LENGTH)), 1);
    x *= ENV_LENGTH;

    ENV_TAB[ENV_LENGTH + i] = (int) x;

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "ATTACK[%d] = %d   DECAY[%d] = %d\n", i, ENV_TAB[i], i, ENV_TAB[ENV_LENGTH + i]);
#endif
  }

  ENV_TAB[ENV_END >> ENV_LBITS] = ENV_LENGTH - 1;    // for the stopped state

  // Tableau pour la conversion Attack -> Decay and Decay -> Attack

  for (i = 0, j = ENV_LENGTH - 1; i < ENV_LENGTH; i++)
  {
    while (j && (ENV_TAB[j] < (unsigned) i))
      j--;

    DECAY_TO_ATTACK[i] = j << ENV_LBITS;
  }

  // Tableau pour le Substain Level

  for (i = 0; i < 15; i++)
  {
    x = i * 3;          // 3 and not 6 (Mickey Mania first music for test)
    x /= ENV_STEP;

    j = (int) x;
    j <<= ENV_LBITS;

    SL_TAB[i] = j + ENV_DECAY;
  }

  j = ENV_LENGTH - 1;        // special case : volume off
  j <<= ENV_LBITS;
  SL_TAB[15] = j + ENV_DECAY;

  // Tableau Frequency Step

  for (i = 0; i < 2048; i++)
  {
    x = (double) (i) * YM2612->Frequence;

    #if ((SIN_LBITS + SIN_HBITS - (21 - 7)) < 0)
      x /= (double) (1 << ((21 - 7) - SIN_LBITS - SIN_HBITS));
    #else
      x *= (double) (1 << (SIN_LBITS + SIN_HBITS - (21 - 7)));
    #endif

    x /= 2.0;  // because MUL = value * 2

    YM2612->FINC_TAB[i] = (unsigned int) x;
  }

  // Tableaux Attack & Decay Rate

  for (i = 0; i < 4; i++)
  {
    YM2612->AR_TAB[i] = 0;
    YM2612->DR_TAB[i] = 0;
  }

  for (i = 0; i < 60; i++)
  {
    x = YM2612->Frequence;

    x *= 1.0 + ((i & 3) * 0.25);                // bits 0-1 : x1.00, x1.25, x1.50, x1.75
    x *= (double) (1 << ((i >> 2)));            // bits 2-5 : shift bits (x2^0 - x2^15)
    x *= (double) (ENV_LENGTH << ENV_LBITS);    // on ajuste pour le tableau ENV_TAB

    YM2612->AR_TAB[i + 4] = (unsigned int) (x / AR_RATE);
    YM2612->DR_TAB[i + 4] = (unsigned int) (x / DR_RATE);
  }

  for (i = 64; i < 96; i++)
  {
    YM2612->AR_TAB[i] = YM2612->AR_TAB[63];
    YM2612->DR_TAB[i] = YM2612->DR_TAB[63];

    NULL_RATE[i - 64] = 0;
  }

  // Tableau Detune

  for (i = 0; i < 4; i++)
  {
    for (j = 0; j < 32; j++)
    {
      #if ((SIN_LBITS + SIN_HBITS - 21) < 0)
        x = (double)DT_DEF_TAB[i][j] * YM2612->Frequence /
            (double)(1 << (21 - SIN_LBITS - SIN_HBITS));
      #else
        x = (double)DT_DEF_TAB[i][j] * YM2612->Frequence *
            (double)(1 << (SIN_LBITS + SIN_HBITS - 21));
      #endif

      YM2612->DT_TAB[i + 0][j] = (int) x;
      YM2612->DT_TAB[i + 4][j] = (int) -x;
    }
  }

  // Tableau LFO

  j = (YM2612->Rate * YM2612->Inter_Step) / 0x4000;

  YM2612->LFO_INC_TAB[0] = (unsigned int) (3.98 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[1] = (unsigned int) (5.56 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[2] = (unsigned int) (6.02 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[3] = (unsigned int) (6.37 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[4] = (unsigned int) (6.88 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[5] = (unsigned int) (9.63 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[6] = (unsigned int) (48.1 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[7] = (unsigned int) (72.2 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);

  YM2612_SetMute(YM2612, 0x00);
  //YM2612_Reset(YM2612);

  return YM2612;
}